

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrefixTools.cpp
# Opt level: O0

TSNode_conflict *
getNamedChildNode(TSNode_conflict *__return_storage_ptr__,TSNode_conflict parent,char *name)

{
  TSNode self;
  undefined1 auVar1 [24];
  TSNode self_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint32_t uVar6;
  int iVar7;
  char *__s1;
  TSTree *__return_storage_ptr___00;
  TSNode_conflict *child;
  uint local_3c;
  uint32_t i;
  uint32_t childCount;
  char *name_local;
  
  auVar1 = parent._8_24_;
  self.tree = (TSTree *)__return_storage_ptr__;
  self.context[0] = auVar1._0_4_;
  self.context[1] = auVar1._4_4_;
  self.context[2] = auVar1._8_4_;
  self.context[3] = auVar1._12_4_;
  self.id = (void *)auVar1._16_8_;
  __return_storage_ptr___00 = (TSTree *)__return_storage_ptr__;
  uVar6 = ts_node_named_child_count(self);
  local_3c = 0;
  while( true ) {
    if (uVar6 <= local_3c) {
      memset(__return_storage_ptr___00,0,0x20);
      return __return_storage_ptr__;
    }
    ts_node_named_child((TSNode *)__return_storage_ptr___00,(TSNode)parent,local_3c);
    uVar2 = __return_storage_ptr___00->language;
    uVar3 = __return_storage_ptr___00->parent_cache;
    uVar4 = __return_storage_ptr___00->parent_cache_start;
    uVar5 = __return_storage_ptr___00->parent_cache_size;
    self_00.id._4_4_ = uVar5;
    self_00.id._0_4_ = uVar4;
    self_00.context._8_8_ = uVar3;
    self_00.context._0_8_ = uVar2;
    self_00.tree = __return_storage_ptr___00;
    __s1 = ts_node_type(self_00);
    iVar7 = strcmp(__s1,name);
    if (iVar7 == 0) break;
    local_3c = local_3c + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

TSNode getNamedChildNode(TSNode parent, const char *name) {
    auto childCount = ts_node_named_child_count(parent);
    for (uint32_t i = 0; i < childCount; i++) {
        TSNode child = ts_node_named_child(parent, i);
        if (std::strcmp(ts_node_type(child), name) == 0) return child;
    }

    return TSNode {};
}